

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_Test::
TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_Test
          (TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorListTest).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  TEST_GROUP_CppUTestGroupMemoryLeakDetectorListTest::
  TEST_GROUP_CppUTestGroupMemoryLeakDetectorListTest
            (&this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorListTest);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorListTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_0035eee0;
  return;
}

Assistant:

TEST(MemoryLeakDetectorListTest, clearAllAccountingIsWorkingProperly)
{
    MemoryLeakDetectorList listForTesting;
    MemoryLeakDetectorNode node1, node2, node3;
    node3.period_ = mem_leak_period_disabled;
    listForTesting.addNewNode(&node1);
    listForTesting.addNewNode(&node2);
    listForTesting.addNewNode(&node3);

    listForTesting.clearAllAccounting(mem_leak_period_enabled);

    POINTERS_EQUAL(NULLPTR, listForTesting.getFirstLeak(mem_leak_period_enabled));
    CHECK(&node3 == listForTesting.getFirstLeak(mem_leak_period_disabled));
}